

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

Bbl_Obj_t * Bbl_ObjFaninNext(Bbl_Obj_t *p,Bbl_Obj_t *pPrev)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = *(uint *)&p->field_0x8 >> 4;
  uVar3 = 0;
  if (0xf < *(uint *)&p->field_0x8) {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if ((p == (Bbl_Obj_t *)0x0) || ((Bbl_Obj_t *)((long)p - (long)(&p[1].Id)[uVar2]) == pPrev))
      break;
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)uVar1;
    } while (uVar1 != uVar2);
  }
  if ((int)(uVar1 - 1) <= (int)uVar3) {
    return (Bbl_Obj_t *)0x0;
  }
  return (Bbl_Obj_t *)((long)p - (long)(&p[1].Fnc)[uVar3 & 0xffffffff]);
}

Assistant:

Bbl_Obj_t * Bbl_ObjFaninNext( Bbl_Obj_t * p, Bbl_Obj_t * pPrev )
{
    Bbl_Obj_t * pFanin;
    int i;
    Bbl_ObjForEachFanin_int( p, pFanin, i )
        if ( pFanin == pPrev )
            break;
    return i < Bbl_ObjFaninNum(p) - 1 ? Bbl_ObjFanin( p, i+1 ) : NULL;
}